

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethercatconfig.c
# Opt level: O2

int ec_findconfig(uint32 man,uint32 id)

{
  int iVar1;
  long lVar2;
  
  lVar2 = 0x4c;
  iVar1 = 1;
  while( true ) {
    if (lVar2 == 0x67c) {
      return 0;
    }
    if ((*(uint32 *)(lVar2 + 0x10dffc) == man) &&
       (*(uint32 *)(ec_configlist[0].name + lVar2 + -8) == id)) break;
    lVar2 = lVar2 + 0x48;
    iVar1 = iVar1 + 1;
  }
  return iVar1;
}

Assistant:

int ec_findconfig( uint32 man, uint32 id)
{
   int i = 0;

   do 
   {
      i++;
   } while ( (ec_configlist[i].man != EC_CONFIGEND) && 
           ((ec_configlist[i].man != man) || (ec_configlist[i].id != id)) );
   if (ec_configlist[i].man == EC_CONFIGEND)
   {
      i = 0;
   }
   return i;
}